

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning.cpp
# Opt level: O1

void get_spanning_tree(void)

{
  ulong *puVar1;
  uint uVar2;
  int v;
  iterator iVar3;
  iterator iVar4;
  int iVar5;
  int iVar6;
  pointer piVar7;
  ostream *poVar8;
  long *plVar9;
  ulong uVar10;
  pair<int,_std::pair<int,_int>_> *ppVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  pair<int,_std::pair<int,_int>_> *result;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  edges_weights;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  results;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  used;
  uint local_c8;
  int iStack_c4;
  uint uStack_c0;
  pair<int,_std::pair<int,_int>_> *local_b8;
  iterator iStack_b0;
  pair<int,_std::pair<int,_int>_> *local_a8;
  ulong local_a0;
  pair<int,_std::pair<int,_int>_> *local_98;
  iterator iStack_90;
  pair<int,_std::pair<int,_int>_> *local_88;
  pair<int,_std::pair<int,_int>_> local_80;
  long local_70;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_68;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  freopen("spanning.txt","w",_stdout);
  iVar12 = 0;
  local_a8 = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_b8 = (pair<int,_std::pair<int,_int>_> *)0x0;
  iStack_b0._M_current = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_88 = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_98 = (pair<int,_std::pair<int,_int>_> *)0x0;
  iStack_90._M_current = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_68.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < V) {
    do {
      local_c8 = local_c8 & 0xffffff00;
      std::
      vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
      ::emplace_back<int&,bool>
                ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                  *)&local_68,&V,(bool *)&local_c8);
      iVar12 = iVar12 + 1;
    } while (iVar12 < V);
  }
  if (0 < V) {
    uVar10 = 0;
    local_38 = 0x800000000000003f;
    do {
      piVar7 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      local_a0 = uVar10;
      if (edge.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar10].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
          piVar7) {
        local_40 = 1L << ((byte)uVar10 & 0x3f);
        local_48 = uVar10 >> 6;
        local_70 = uVar10 * 5;
        uVar13 = 0;
        do {
          uVar2 = piVar7[uVar13];
          uVar15 = (ulong)(int)uVar2;
          uVar17 = uVar15 + 0x3f;
          if (-1 < (long)uVar15) {
            uVar17 = uVar15;
          }
          uVar18 = (ulong)((uVar15 & local_38) < 0x8000000000000001);
          if (((&((local_68.
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p)[local_70]
               [((long)uVar17 >> 6) + uVar18 + 0xffffffffffffffff] >> (uVar15 & 0x3f) & 1) == 0) {
            uStack_c0 = uVar2 | (uint)(local_a0 >> 0x20);
            local_c8 = weight.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[uVar13];
            iStack_c4 = (int)local_a0;
            local_80.second.first = iStack_c4;
            local_80.first = local_c8;
            local_80.second.second = uStack_c0;
            if (iStack_b0._M_current == local_a8) {
              std::
              vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
              ::_M_realloc_insert<std::pair<int,std::pair<int,int>>>
                        ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                          *)&local_b8,iStack_b0,&local_80);
            }
            else {
              ((iStack_b0._M_current)->second).second = uStack_c0;
              (iStack_b0._M_current)->first = local_c8;
              ((iStack_b0._M_current)->second).first = iStack_c4;
              iStack_b0._M_current = iStack_b0._M_current + 1;
            }
            puVar1 = (&((local_68.
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p)[local_70] +
                     ((long)uVar17 >> 6) + uVar18 + 0xffffffffffffffff;
            *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
            puVar1 = local_68.
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p + local_48;
            *puVar1 = *puVar1 | local_40;
          }
          uVar13 = uVar13 + 1;
          piVar7 = edge.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        } while (uVar13 < (ulong)((long)edge.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar7 >> 2));
      }
      uVar10 = local_a0 + 1;
    } while ((long)uVar10 < (long)V);
  }
  iVar3._M_current = iStack_b0._M_current;
  ppVar11 = local_b8;
  if (local_b8 != iStack_b0._M_current) {
    uVar10 = ((long)iStack_b0._M_current - (long)local_b8 >> 2) * -0x5555555555555555;
    lVar14 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,std::pair<int,int>>*,std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<int,std::pair<int,int>>>>>
              (local_b8,iStack_b0._M_current,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::pair<int,int>>*,std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<int,std::pair<int,int>>>>>
              (ppVar11,iVar3._M_current);
  }
  local_c8 = 0;
  if (0 < V) {
    do {
      if (DAT_001193e0._M_current == DAT_001193e8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::p,DAT_001193e0,
                   (int *)&local_c8);
      }
      else {
        *DAT_001193e0._M_current = local_c8;
        DAT_001193e0._M_current = DAT_001193e0._M_current + 1;
      }
      local_c8 = local_c8 + 1;
    } while ((int)local_c8 < V);
  }
  ppVar11 = local_98;
  iVar3._M_current = iStack_90._M_current;
  if (0 < E) {
    lVar16 = 0;
    lVar14 = 0;
    do {
      iVar12 = *(int *)((long)&(local_b8->second).first + lVar16);
      v = *(int *)((long)&(local_b8->second).second + lVar16);
      iVar5 = dsu_get(iVar12);
      iVar6 = dsu_get(v);
      if (iVar5 != iVar6) {
        ppVar11 = (pair<int,_std::pair<int,_int>_> *)((long)&local_b8->first + lVar16);
        if (iStack_90._M_current == local_88) {
          std::
          vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
          ::_M_realloc_insert<std::pair<int,std::pair<int,int>>const&>
                    ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                      *)&local_98,iStack_90,ppVar11);
        }
        else {
          ((iStack_90._M_current)->second).second = (ppVar11->second).second;
          iVar5 = (ppVar11->second).first;
          (iStack_90._M_current)->first = ppVar11->first;
          ((iStack_90._M_current)->second).first = iVar5;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        dsu_unite(iVar12,v);
      }
      lVar14 = lVar14 + 1;
      lVar16 = lVar16 + 0xc;
      ppVar11 = local_98;
      iVar3._M_current = iStack_90._M_current;
    } while (lVar14 < E);
  }
  for (; iVar4._M_current = iStack_90._M_current, ppVar11 != iStack_90._M_current;
      ppVar11 = ppVar11 + 1) {
    iStack_90._M_current = iVar3._M_current;
    poVar8 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(ppVar11->second).first]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(ppVar11->second).second]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    plVar9 = (long *)std::ostream::operator<<(poVar8,ppVar11->first);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    iVar3._M_current = iStack_90._M_current;
    iStack_90._M_current = iVar4._M_current;
  }
  iStack_90._M_current = iVar3._M_current;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_68);
  if (local_98 != (pair<int,_std::pair<int,_int>_> *)0x0) {
    operator_delete(local_98);
  }
  if (local_b8 != (pair<int,_std::pair<int,_int>_> *)0x0) {
    operator_delete(local_b8);
  }
  return;
}

Assistant:

void get_spanning_tree() {
    freopen("spanning.txt", "w", stdout); // output file

    vector < pair < int, pair<int, int> > > edges_weights, results;

    vector < vector<bool> > used;
    for (int i = 0; i < V; i++) {
        used.emplace_back(V, false);
    }

    for (int i = 0; i < V; i++) {
        for (int j = 0; j < edge[i].size(); j++) {
            int cur_v = edge[i][j];
            if (!used[i][cur_v]) {
                edges_weights.push_back(make_pair(weight[i][j], make_pair(i, cur_v)));
                used[i][cur_v] = true;
                used[cur_v][i] = true;
            }
        }
    }

    sort(edges_weights.begin(), edges_weights.end(), greater< pair < int, pair<int, int> > >());

    for (int i = 0; i < V; i++) {
        p.push_back(i);
    }

    for (int i = 0; i < E; i++) {
        int u = edges_weights[i].second.first;
        int v = edges_weights[i].second.second;
        int w = edges_weights[i].first;
        (void)w;

        if (dsu_get(u) != dsu_get(v)) {
            results.push_back(edges_weights[i]);
            dsu_unite(u, v);
        }
    }

    for (const auto& result : results) {
        cout << id[result.second.first] << " " << id[result.second.second] << " " << result.first << endl;
    }
}